

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

bool __thiscall Cleaner::FileExists(Cleaner *this,string *path)

{
  long lVar1;
  undefined8 uVar2;
  TimeStamp mtime;
  string err;
  string *path_local;
  Cleaner *this_local;
  
  err.field_2._8_8_ = path;
  std::__cxx11::string::string((string *)&mtime);
  lVar1 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                    (this->disk_interface_,err.field_2._8_8_,(string *)&mtime);
  if (lVar1 == -1) {
    uVar2 = std::__cxx11::string::c_str();
    Error("%s",uVar2);
  }
  std::__cxx11::string::~string((string *)&mtime);
  return 0 < lVar1;
}

Assistant:

bool Cleaner::FileExists(const string& path) {
  string err;
  TimeStamp mtime = disk_interface_->Stat(path, &err);
  if (mtime == -1)
    Error("%s", err.c_str());
  return mtime > 0;  // Treat Stat() errors as "file does not exist".
}